

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DearchiverBase.cpp
# Opt level: O1

bool __thiscall Diligent::DearchiverBase::Store(DearchiverBase *this,IDataBlob **ppArchive)

{
  pointer pAVar1;
  _Head_base<0UL,_const_Diligent::DeviceObjectArchive_*,_false> Src;
  Uint32 ContentVersion;
  long lVar2;
  ArchiveData *Archive;
  pointer pAVar3;
  bool bVar4;
  string msg;
  undefined1 local_110 [224];
  RefCntAutoPtr<Diligent::IDataBlob> local_30;
  
  if (ppArchive == (IDataBlob **)0x0) {
    FormatString<char[27]>((string *)local_110,(char (*) [27])"ppArchive must not be null");
    DebugAssertionFailed
              ((Char *)local_110._0_8_,"Store",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DearchiverBase.cpp"
               ,0x361);
    if ((undefined1 *)local_110._0_8_ != local_110 + 0x10) {
      operator_delete((void *)local_110._0_8_,local_110._16_8_ + 1);
    }
    bVar4 = false;
  }
  else {
    if (*ppArchive != (IDataBlob *)0x0) {
      FormatString<char[125]>
                ((string *)local_110,
                 (char (*) [125])
                 "*ppArchive must be null - make sure you are not overwriting reference to an existing object as this will cause memory leaks."
                );
      DebugAssertionFailed
                ((Char *)local_110._0_8_,"Store",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DearchiverBase.cpp"
                 ,0x365);
      if ((undefined1 *)local_110._0_8_ != local_110 + 0x10) {
        operator_delete((void *)local_110._0_8_,local_110._16_8_ + 1);
      }
    }
    pAVar3 = (this->m_Archives).
             super__Vector_base<Diligent::DearchiverBase::ArchiveData,_std::allocator<Diligent::DearchiverBase::ArchiveData>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if (pAVar3 == (this->m_Archives).
                  super__Vector_base<Diligent::DearchiverBase::ArchiveData,_std::allocator<Diligent::DearchiverBase::ArchiveData>_>
                  ._M_impl.super__Vector_impl_data._M_finish) {
      ContentVersion = 0;
    }
    else {
      ContentVersion =
           ((pAVar3->pObjArchive)._M_t.
            super___uniq_ptr_impl<const_Diligent::DeviceObjectArchive,_std::default_delete<const_Diligent::DeviceObjectArchive>_>
            ._M_t.
            super__Tuple_impl<0UL,_const_Diligent::DeviceObjectArchive_*,_std::default_delete<const_Diligent::DeviceObjectArchive>_>
            .super__Head_base<0UL,_const_Diligent::DeviceObjectArchive_*,_false>._M_head_impl)->
           m_ContentVersion;
    }
    DeviceObjectArchive::DeviceObjectArchive((DeviceObjectArchive *)local_110,ContentVersion);
    pAVar3 = (this->m_Archives).
             super__Vector_base<Diligent::DearchiverBase::ArchiveData,_std::allocator<Diligent::DearchiverBase::ArchiveData>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pAVar1 = (this->m_Archives).
             super__Vector_base<Diligent::DearchiverBase::ArchiveData,_std::allocator<Diligent::DearchiverBase::ArchiveData>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (pAVar3 != pAVar1) {
      do {
        Src._M_head_impl =
             (pAVar3->pObjArchive)._M_t.
             super___uniq_ptr_impl<const_Diligent::DeviceObjectArchive,_std::default_delete<const_Diligent::DeviceObjectArchive>_>
             ._M_t.
             super__Tuple_impl<0UL,_const_Diligent::DeviceObjectArchive_*,_std::default_delete<const_Diligent::DeviceObjectArchive>_>
             .super__Head_base<0UL,_const_Diligent::DeviceObjectArchive_*,_false>._M_head_impl;
        if (Src._M_head_impl != (DeviceObjectArchive *)0x0) {
          DeviceObjectArchive::Merge((DeviceObjectArchive *)local_110,Src._M_head_impl);
        }
        pAVar3 = pAVar3 + 1;
      } while (pAVar3 != pAVar1);
    }
    DeviceObjectArchive::Serialize((DeviceObjectArchive *)local_110,ppArchive);
    bVar4 = *ppArchive != (IDataBlob *)0x0;
    if (local_30.m_pObject != (IDataBlob *)0x0) {
      (*((local_30.m_pObject)->super_IObject)._vptr_IObject[2])();
      local_30.m_pObject = (IDataBlob *)0x0;
    }
    lVar2 = 200;
    do {
      std::vector<Diligent::SerializedData,_std::allocator<Diligent::SerializedData>_>::~vector
                ((vector<Diligent::SerializedData,_std::allocator<Diligent::SerializedData>_> *)
                 (local_110 + lVar2));
      lVar2 = lVar2 + -0x18;
    } while (lVar2 != 0x20);
    std::
    _Hashtable<Diligent::DeviceObjectArchive::NamedResourceKey,_std::pair<const_Diligent::DeviceObjectArchive::NamedResourceKey,_Diligent::DeviceObjectArchive::ResourceData>,_std::allocator<std::pair<const_Diligent::DeviceObjectArchive::NamedResourceKey,_Diligent::DeviceObjectArchive::ResourceData>_>,_std::__detail::_Select1st,_std::equal_to<Diligent::DeviceObjectArchive::NamedResourceKey>,_Diligent::DeviceObjectArchive::NamedResourceKey::Hasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
    ::~_Hashtable((_Hashtable<Diligent::DeviceObjectArchive::NamedResourceKey,_std::pair<const_Diligent::DeviceObjectArchive::NamedResourceKey,_Diligent::DeviceObjectArchive::ResourceData>,_std::allocator<std::pair<const_Diligent::DeviceObjectArchive::NamedResourceKey,_Diligent::DeviceObjectArchive::ResourceData>_>,_std::__detail::_Select1st,_std::equal_to<Diligent::DeviceObjectArchive::NamedResourceKey>,_Diligent::DeviceObjectArchive::NamedResourceKey::Hasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                   *)local_110);
  }
  return bVar4;
}

Assistant:

bool DearchiverBase::Store(IDataBlob** ppArchive) const
{
    if (ppArchive == nullptr)
    {
        DEV_ERROR("ppArchive must not be null");
        return false;
    }
    DEV_CHECK_ERR(*ppArchive == nullptr, "*ppArchive must be null - make sure you are not overwriting "
                                         "reference to an existing object as this will cause memory leaks.");

    try
    {
        DeviceObjectArchive MergedArchive{!m_Archives.empty() ? m_Archives.front().pObjArchive->GetContentVersion() : 0};
        for (const ArchiveData& Archive : m_Archives)
        {
            if (Archive.pObjArchive)
                MergedArchive.Merge(*Archive.pObjArchive);
        }

        MergedArchive.Serialize(ppArchive);
        return *ppArchive != nullptr;
    }
    catch (...)
    {
        return false;
    }
}